

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_split_output(aec_stream_conflict *strm)

{
  int n;
  int iVar1;
  int iVar2;
  internal_state_conflict *piVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t uVar6;
  uint uVar7;
  internal_state_conflict *piVar8;
  ulong uVar9;
  
  piVar3 = strm->state;
  iVar1 = piVar3->id;
  n = iVar1 + -1;
  while( true ) {
    uVar6 = bits_ask(strm,n);
    if (uVar6 == 0) {
      return 0;
    }
    uVar4 = strm->avail_out;
    uVar9 = (ulong)piVar3->bytes_per_sample;
    if (uVar4 < uVar9) break;
    if (n == 0) {
      piVar3->rsip = piVar3->rsip + 1;
      piVar8 = strm->state;
    }
    else {
      piVar8 = strm->state;
      uVar9 = piVar8->acc;
      iVar2 = piVar8->bitp;
      puVar5 = piVar3->rsip;
      piVar3->rsip = puVar5 + 1;
      *puVar5 = *puVar5 + ((uint)(uVar9 >> ((char)iVar2 - (char)n & 0x3fU)) &
                          (uint)(0xffffffffffffffff >> (0x41U - (char)iVar1 & 0x3f)));
      uVar9 = (ulong)piVar3->bytes_per_sample;
    }
    strm->avail_out = uVar4 - uVar9;
    piVar8->bitp = piVar8->bitp - n;
    uVar7 = piVar3->sample_counter + 1;
    piVar3->sample_counter = uVar7;
    if (piVar3->encoded_block_size <= uVar7) {
      piVar3->mode = m_next_cds;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_split_output(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    int k = state->id - 1;

    do {
        if (bits_ask(strm, k) == 0 || strm->avail_out < state->bytes_per_sample)
            return M_EXIT;
        if (k)
            *state->rsip++ += bits_get(strm, k);
        else
            state->rsip++;
        strm->avail_out -= state->bytes_per_sample;
        bits_drop(strm, k);
    } while(++state->sample_counter < state->encoded_block_size);

    state->mode = m_next_cds;
    return M_CONTINUE;
}